

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# directory.cpp
# Opt level: O1

int __thiscall hta::storage::file::Directory::open(Directory *this,char *__file,int __oflag,...)

{
  Metric *pMVar1;
  logic_error *this_00;
  int in_ECX;
  path path;
  path local_98 [2];
  path local_48;
  
  std::filesystem::__cxx11::path::path<std::__cxx11::string,std::filesystem::__cxx11::path>
            (&local_48,___oflag,auto_format);
  Catch::clara::std::filesystem::__cxx11::operator/(local_98,(path *)(__file + 8),(path *)&local_48)
  ;
  Catch::clara::std::filesystem::__cxx11::path::~path((path *)&local_48);
  std::filesystem::create_directory((path *)local_98);
  if (in_ECX == 2) {
    pMVar1 = (Metric *)operator_new(0x2e8);
    Metric::Metric<hta::storage::file::FileOpenTag::ReadWrite>(pMVar1,local_98);
  }
  else if (in_ECX == 1) {
    pMVar1 = (Metric *)operator_new(0x2e8);
    Metric::Metric<hta::storage::file::FileOpenTag::Write>(pMVar1,local_98);
  }
  else {
    if (in_ECX != 0) {
      this_00 = (logic_error *)__cxa_allocate_exception(0x10);
      std::logic_error::logic_error(this_00,"unknown OpenMode");
      __cxa_throw(this_00,&std::logic_error::typeinfo,std::logic_error::~logic_error);
    }
    pMVar1 = (Metric *)operator_new(0x2e8);
    Metric::Metric(pMVar1,local_98);
  }
  (this->super_Directory)._vptr_Directory = (_func_int **)pMVar1;
  Catch::clara::std::filesystem::__cxx11::path::~path(local_98);
  return (int)this;
}

Assistant:

std::unique_ptr<storage::Metric> Directory::open(const std::string& name, Mode mode, Meta meta)
{
    auto path = directory_ / std::filesystem::path(name);
    // Don't do that in the metric itself (member initialization before constructor body)
    try
    {
        // We do not recursively create the directory
        // to avoid creating fresh databases in unmounted filesystems
        std::filesystem::create_directory(path);
    }
    catch (const std::filesystem::filesystem_error& e)
    {
        throw_exception(
            "Failed to create metric directory. Make sure the parent directory exists. ", path,
            ": ", e.what());
    }
    switch (mode)
    {
    case Mode::read:
        return std::make_unique<Metric>(FileOpenTag::Read(), path);
    case Mode::write:
        return std::make_unique<Metric>(FileOpenTag::Write(), path, meta);
    case Mode::read_write:
        return std::make_unique<Metric>(FileOpenTag::ReadWrite(), path, meta);
    default:
        throw std::logic_error("unknown OpenMode");
    }
}